

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O1

int enet_socket_set_option(ENetSocket socket,ENetSocketOption option,int value)

{
  uint uVar1;
  int iVar2;
  long *__optval;
  int __optname;
  socklen_t __optlen;
  timeval timeVal;
  int local_24;
  long local_20;
  long local_18;
  
  iVar2 = -1;
  local_24 = value;
  switch(option) {
  case ENET_SOCKOPT_NONBLOCK:
    uVar1 = fcntl(socket,3);
    iVar2 = fcntl(socket,4,(ulong)((uint)(value != 0) << 0xb | uVar1 & 0xfffff7ff));
    goto switchD_00107d6d_caseD_8;
  case ENET_SOCKOPT_BROADCAST:
    iVar2 = 1;
    __optname = 6;
    break;
  case ENET_SOCKOPT_RCVBUF:
    iVar2 = 1;
    __optname = 8;
    break;
  case ENET_SOCKOPT_SNDBUF:
    iVar2 = 1;
    __optname = 7;
    break;
  case ENET_SOCKOPT_REUSEADDR:
    iVar2 = 1;
    goto LAB_00107e99;
  case ENET_SOCKOPT_RCVTIMEO:
    __optname = 0x14;
    goto LAB_00107e54;
  case ENET_SOCKOPT_SNDTIMEO:
    __optname = 0x15;
LAB_00107e54:
    local_18 = (long)((value % 1000) * 1000);
    local_20 = (long)(value / 1000);
    __optval = &local_20;
    iVar2 = 1;
    __optlen = 0x10;
    goto LAB_00107ea4;
  default:
    goto switchD_00107d6d_caseD_8;
  case ENET_SOCKOPT_NODELAY:
    iVar2 = 6;
    __optname = 1;
    break;
  case ENET_SOCKOPT_TTL:
    iVar2 = 0;
LAB_00107e99:
    __optname = 2;
  }
  __optval = (long *)&local_24;
  __optlen = 4;
LAB_00107ea4:
  iVar2 = setsockopt(socket,iVar2,__optname,__optval,__optlen);
switchD_00107d6d_caseD_8:
  return -(uint)(iVar2 == -1);
}

Assistant:

int
enet_socket_set_option (ENetSocket socket, ENetSocketOption option, int value)
{
    int result = -1;
    switch (option)
    {
        case ENET_SOCKOPT_NONBLOCK:
#ifdef HAS_FCNTL
            result = fcntl (socket, F_SETFL, (value ? O_NONBLOCK : 0) | (fcntl (socket, F_GETFL) & ~O_NONBLOCK));
#else
            result = ioctl (socket, FIONBIO, & value);
#endif
            break;

        case ENET_SOCKOPT_BROADCAST:
            result = setsockopt (socket, SOL_SOCKET, SO_BROADCAST, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_REUSEADDR:
            result = setsockopt (socket, SOL_SOCKET, SO_REUSEADDR, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_RCVBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_SNDBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_SNDBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_RCVTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_SNDTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_SNDTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_NODELAY:
            result = setsockopt (socket, IPPROTO_TCP, TCP_NODELAY, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_TTL:
            result = setsockopt (socket, IPPROTO_IP, IP_TTL, (char *) & value, sizeof (int));
            break;

        default:
            break;
    }
    return result == -1 ? -1 : 0;
}